

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int geopolyUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **aData,sqlite_int64 *pRowid)

{
  long lVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Mem *pMem;
  sqlite3_value *psVar6;
  Vdbe *p_00;
  sqlite3_mutex *psVar7;
  RtreeNode *pNode;
  int iVar8;
  undefined1 *puVar9;
  char *pcVar10;
  GeoPoly *p_01;
  byte bVar11;
  Vdbe *p;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  long in_FS_OFFSET;
  bool bVar15;
  RtreeNode *pLeaf;
  int rc;
  RtreeCell cell;
  undefined1 *local_88;
  RtreeNode *local_78;
  int local_6c;
  RtreeCell local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c = 0;
  local_68.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
  local_68.aCoord[0].i = -1;
  local_68.aCoord[1].i = -1;
  local_68.aCoord[2].i = -1;
  local_68.aCoord[3].i = -1;
  local_68.aCoord[4].i = -1;
  local_68.aCoord[5].i = -1;
  local_68.aCoord[6].i = -1;
  local_68.aCoord[7].i = -1;
  local_68.aCoord[8] = (RtreeCoord)0xffffffff;
  local_68.aCoord[9] = (RtreeCoord)0xffffffff;
  iVar8 = 0x206;
  if (*(int *)((long)&pVtab[3].zErrMsg + 4) != 0) goto LAB_001ffc7e;
  *(int *)&pVtab[3].pModule = *(int *)&pVtab[3].pModule + 1;
  pMem = *aData;
  uVar3._0_2_ = pMem->flags;
  uVar3._2_1_ = pMem->enc;
  uVar3._3_1_ = pMem->eSubtype;
  uVar12 = 0x5555555555555555 >> ((byte)(undefined2)uVar3 & 0x3f);
  if ((0x5555555555555555U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
    local_88 = (undefined1 *)0x0;
  }
  else {
    local_88 = (undefined1 *)sqlite3VdbeIntValue(pMem);
  }
  if (nData < 2) {
    bVar15 = false;
  }
  else {
    psVar6 = aData[1];
    uVar4._0_2_ = psVar6->flags;
    uVar4._2_1_ = psVar6->enc;
    uVar4._3_1_ = psVar6->eSubtype;
    bVar15 = (0x5555555555555555U >> ((ulong)uVar4 & 0x3f) & 1) != 0;
  }
  if (bVar15) {
    puVar9 = (undefined1 *)sqlite3VdbeIntValue(aData[1]);
  }
  else {
    puVar9 = (undefined1 *)0x0;
  }
  bVar11 = (byte)uVar12;
  local_68.iRowid = (i64)puVar9;
  if ((nData < 2) ||
     (((uVar12 & 1) != 0 &&
      (psVar6 = aData[2], uVar5._0_2_ = psVar6->flags, uVar5._2_1_ = psVar6->enc,
      uVar5._3_1_ = psVar6->eSubtype, (~uVar5 & 0x401) == 0 && local_88 == puVar9)))) {
    bVar13 = 0;
LAB_001ff99e:
    if ((local_6c == 0) && ((nData == 1 || ((bVar11 & bVar13) != 0)))) {
      local_6c = rtreeDeleteRowid((Rtree *)pVtab,(sqlite3_int64)local_88);
    }
    if ((bVar13 & 1 < nData & local_6c == 0) == 1) {
      local_78 = (RtreeNode *)0x0;
      if (!bVar15) {
        local_6c = rtreeNewRowid((Rtree *)pVtab,&local_68.iRowid);
      }
      *pRowid = local_68.iRowid;
      if (local_6c == 0) {
        local_6c = ChooseLeaf((Rtree *)pVtab,&local_68,0,&local_78);
      }
      pNode = local_78;
      if (local_6c == 0) {
        local_6c = rtreeInsertCell((Rtree *)pVtab,local_78,&local_68,0);
        iVar8 = nodeRelease((Rtree *)pVtab,pNode);
        if (local_6c == 0) {
          local_6c = iVar8;
        }
      }
    }
    if ((1 < nData) && (local_6c == 0)) {
      p_00 = (Vdbe *)pVtab[7].zErrMsg;
      sqlite3_bind_int64((sqlite3_stmt *)p_00,1,local_68.iRowid);
      uVar2 = aData[2]->flags;
      if ((~uVar2 & 0x401) == 0) {
        iVar8 = vdbeUnbind(p_00,1);
        bVar15 = false;
        if ((iVar8 == 0) && (psVar7 = p_00->db->mutex, psVar7 != (sqlite3_mutex *)0x0)) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar7);
          bVar15 = false;
        }
      }
      else {
        if ((0x4000000040004U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
          p_01 = (GeoPoly *)0x0;
LAB_001ffb31:
          sqlite3_bind_value((sqlite3_stmt *)p_00,2,aData[2]);
        }
        else {
          p_01 = geopolyFuncParam((sqlite3_context *)0x0,aData[2],&local_6c);
          if ((p_01 == (GeoPoly *)0x0) || (local_6c != 0)) goto LAB_001ffb31;
          bindText((sqlite3_stmt *)p_00,2,p_01->hdr,(long)p_01->nVertex * 8 + 4,
                   (_func_void_void_ptr *)0xffffffffffffffff,'\0');
        }
        sqlite3_free(p_01);
        bVar15 = true;
      }
      if (3 < nData) {
        lVar14 = 3;
        do {
          sqlite3_bind_value((sqlite3_stmt *)p_00,(int)lVar14,aData[lVar14]);
          lVar1 = lVar14 - (ulong)(nData - 2);
          lVar14 = lVar14 + 1;
        } while (lVar1 != 1);
        bVar15 = true;
      }
      if (bVar15) {
        sqlite3_step((sqlite3_stmt *)p_00);
        local_6c = sqlite3_reset((sqlite3_stmt *)p_00);
      }
    }
  }
  else {
    geopolyBBox((sqlite3_context *)0x0,aData[2],local_68.aCoord,&local_6c);
    if (local_6c == 0) {
      bVar13 = 1;
      if ((bVar15) && ((local_88 == puVar9 & bVar11) == 0)) {
        sqlite3_bind_int64((sqlite3_stmt *)pVtab[5].zErrMsg,1,local_68.iRowid);
        iVar8 = sqlite3_step((sqlite3_stmt *)pVtab[5].zErrMsg);
        local_6c = sqlite3_reset((sqlite3_stmt *)pVtab[5].zErrMsg);
        if (iVar8 == 100) {
          if (*(char *)((long)&(pVtab[1].pModule)->xUpdate + 4) == '\x05') {
            local_6c = rtreeDeleteRowid((Rtree *)pVtab,local_68.iRowid);
          }
          else {
            local_6c = rtreeConstraintError((Rtree *)pVtab,0);
          }
        }
      }
      goto LAB_001ff99e;
    }
    if (local_6c == 1) {
      pcVar10 = sqlite3_mprintf("_shape does not contain a valid polygon");
      pVtab->zErrMsg = pcVar10;
    }
  }
  rtreeRelease((Rtree *)pVtab);
  iVar8 = local_6c;
LAB_001ffc7e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

static int geopolyUpdate(
  sqlite3_vtab *pVtab,
  int nData,
  sqlite3_value **aData,
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  i64 oldRowid;                   /* The old rowid */
  int oldRowidValid;              /* True if oldRowid is valid */
  i64 newRowid;                   /* The new rowid */
  int newRowidValid;              /* True if newRowid is valid */
  int coordChange = 0;            /* Change in coordinates */

  if( pRtree->nNodeRef ){
    /* Unable to write to the btree while another cursor is reading from it,
    ** since the write might do a rebalance which would disrupt the read
    ** cursor. */
    return SQLITE_LOCKED_VTAB;
  }
  rtreeReference(pRtree);
  assert(nData>=1);

  oldRowidValid = sqlite3_value_type(aData[0])!=SQLITE_NULL;;
  oldRowid = oldRowidValid ? sqlite3_value_int64(aData[0]) : 0;
  newRowidValid = nData>1 && sqlite3_value_type(aData[1])!=SQLITE_NULL;
  newRowid = newRowidValid ? sqlite3_value_int64(aData[1]) : 0;
  cell.iRowid = newRowid;

  if( nData>1                                 /* not a DELETE */
   && (!oldRowidValid                         /* INSERT */
        || !sqlite3_value_nochange(aData[2])  /* UPDATE _shape */
        || oldRowid!=newRowid)                /* Rowid change */
  ){
    assert( aData[2]!=0 );
    geopolyBBox(0, aData[2], cell.aCoord, &rc);
    if( rc ){
      if( rc==SQLITE_ERROR ){
        pVtab->zErrMsg =
          sqlite3_mprintf("_shape does not contain a valid polygon");
      }
      goto geopoly_update_end;
    }
    coordChange = 1;

    /* If a rowid value was supplied, check if it is already present in
    ** the table. If so, the constraint has failed. */
    if( newRowidValid && (!oldRowidValid || oldRowid!=newRowid) ){
      int steprc;
      sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
      steprc = sqlite3_step(pRtree->pReadRowid);
      rc = sqlite3_reset(pRtree->pReadRowid);
      if( SQLITE_ROW==steprc ){
        if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
          rc = rtreeDeleteRowid(pRtree, cell.iRowid);
        }else{
          rc = rtreeConstraintError(pRtree, 0);
        }
      }
    }
  }

  /* If aData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( rc==SQLITE_OK && (nData==1 || (coordChange && oldRowidValid)) ){
    rc = rtreeDeleteRowid(pRtree, oldRowid);
  }

  /* If the aData[] array contains more than one element, elements
  ** (aData[2]..aData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 && coordChange ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;
    if( !newRowidValid ){
      rc = rtreeNewRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;
    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
  }

  /* Change the data */
  if( rc==SQLITE_OK && nData>1 ){
    sqlite3_stmt *pUp = pRtree->pWriteAux;
    int jj;
    int nChange = 0;
    sqlite3_bind_int64(pUp, 1, cell.iRowid);
    assert( pRtree->nAux>=1 );
    if( sqlite3_value_nochange(aData[2]) ){
      sqlite3_bind_null(pUp, 2);
    }else{
      GeoPoly *p = 0;
      if( sqlite3_value_type(aData[2])==SQLITE_TEXT
       && (p = geopolyFuncParam(0, aData[2], &rc))!=0
       && rc==SQLITE_OK
      ){
        sqlite3_bind_blob(pUp, 2, p->hdr, 4+8*p->nVertex, SQLITE_TRANSIENT);
      }else{
        sqlite3_bind_value(pUp, 2, aData[2]);
      }
      sqlite3_free(p);
      nChange = 1;
    }
    for(jj=1; jj<nData-2; jj++){
      nChange++;
      sqlite3_bind_value(pUp, jj+2, aData[jj+2]);
    }
    if( nChange ){
      sqlite3_step(pUp);
      rc = sqlite3_reset(pUp);
    }
  }

geopoly_update_end:
  rtreeRelease(pRtree);
  return rc;
}